

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O3

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::UnitType,_char> *ut)

{
  UnitType UVar1;
  ostream *poVar2;
  JSON<const_char_*,_char> local_28;
  char *local_18;
  char local_9;
  
  UVar1 = *ut->object;
  switch(UVar1) {
  case DW_UT_compile:
    local_18 = "DW_UT_compile";
    break;
  case DW_UT_type:
    local_18 = "DW_UT_type";
    break;
  case DW_UT_partial:
    local_18 = "DW_UT_partial";
    break;
  case DW_UT_skeleton:
    local_18 = "DW_UT_skeleton";
    break;
  case DW_UT_split_compile:
    local_18 = "DW_UT_split_compile";
    break;
  case DW_UT_split_type:
    local_18 = "DW_UT_split_type";
    break;
  default:
    if (UVar1 == DW_UT_lo_user) {
      local_18 = "DW_UT_lo_user";
    }
    else {
      if (UVar1 != DW_UT_hi_user) {
        poVar2 = (ostream *)std::ostream::operator<<(os,UVar1);
        return poVar2;
      }
      local_18 = "DW_UT_hi_user";
    }
  }
  local_9 = '\0';
  local_28.context = &local_9;
  local_28.object = &local_18;
  poVar2 = operator<<(os,&local_28);
  return poVar2;
}

Assistant:

std::ostream & operator << (std::ostream &os, const JSON<Dwarf::UnitType> &ut) {
#define DWARF_UNIT_TYPE(x,y) case Dwarf::x: return os << json(#x);
    switch (ut.object) {
#include "libpstack/dwarf/unittype.h"
    default: return os << json(int(ut.object));
    }
#undef DWARF_UNIT_TYPE
}